

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::UnconditionalBranchDirectiveSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,UnconditionalBranchDirectiveSyntax *this,
          size_t index)

{
  Token token;
  SyntaxNode *local_50;
  size_t index_local;
  UnconditionalBranchDirectiveSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->super_DirectiveSyntax).directive.kind;
    token._2_1_ = (this->super_DirectiveSyntax).directive.field_0x2;
    token.numFlags.raw = (this->super_DirectiveSyntax).directive.numFlags.raw;
    token.rawLen = (this->super_DirectiveSyntax).directive.rawLen;
    token.info = (this->super_DirectiveSyntax).directive.info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    local_50 = (SyntaxNode *)0x0;
    if (this != (UnconditionalBranchDirectiveSyntax *)0xffffffffffffffe0) {
      local_50 = &(this->disabledTokens).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_50);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax UnconditionalBranchDirectiveSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return directive;
        case 1: return &disabledTokens;
        default: return nullptr;
    }
}